

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryAnim(AssbinExport *this,IOStream *container,aiAnimation *anim)

{
  aiNodeAnim *nd;
  uint a;
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiAnimation *anim_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)anim;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x123b,0x1000);
  Write<aiString>((IOStream *)local_58,(aiString *)chunk.initial);
  Write<double>((IOStream *)local_58,(double *)(chunk.initial + 0x408));
  Write<double>((IOStream *)local_58,(double *)(chunk.initial + 0x410));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x418));
  for (nd._0_4_ = 0; (uint)nd < *(uint *)(chunk.initial + 0x418); nd._0_4_ = (uint)nd + 1) {
    WriteBinaryNodeAnim(this,(IOStream *)local_58,
                        *(aiNodeAnim **)(*(long *)(chunk.initial + 0x420) + (ulong)(uint)nd * 8));
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryAnim( IOStream * container, const aiAnimation* anim )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIANIMATION );

        Write<aiString>(&chunk,anim->mName);
        Write<double>(&chunk,anim->mDuration);
        Write<double>(&chunk,anim->mTicksPerSecond);
        Write<unsigned int>(&chunk,anim->mNumChannels);

        for (unsigned int a = 0; a < anim->mNumChannels;++a) {
            const aiNodeAnim* nd = anim->mChannels[a];
            WriteBinaryNodeAnim(&chunk,nd);
        }
    }